

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::lts_20250127::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a)

{
  bool bVar1;
  size_type sVar2;
  Nullable<const_char_*> pcVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Nonnull<char_*> pcVar7;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *a_local;
  Nonnull<std::string_*> dest_local;
  
  sVar2 = AlphaNum::size(a);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data(a);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                  ,0xbb,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
  }
  lVar4 = std::__cxx11::string::size();
  sVar2 = AlphaNum::size(a);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest,sVar2);
  lVar6 = std::__cxx11::string::operator[]((ulong)dest);
  pcVar7 = anon_unknown_5::Append((Nonnull<char_*>)(lVar6 + lVar4),a);
  lVar4 = std::__cxx11::string::size();
  if (pcVar7 == (Nonnull<char_*>)(lVar6 + lVar4)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                ,0xc1,"void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &)");
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a) {
  ASSERT_NO_OVERLAP(*dest, a);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  assert(out == begin + dest->size());
}